

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O0

interval_t duckdb::ToYearsOperator::Operation<long,duckdb::interval_t>(long input)

{
  interval_t iVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  int iinput;
  interval_t result;
  allocator local_41;
  string local_40 [16];
  long in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int local_10;
  undefined4 uStack_c;
  int64_t local_8;
  
  iVar3 = Cast::Operation<long,int>(in_stack_ffffffffffffffd0);
  uStack_c = 0;
  local_8 = 0;
  bVar2 = duckdb::TryMultiplyOperator::Operation<int,int,int>(iVar3,0xc,&local_10);
  if (!bVar2) {
    uVar4 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Interval value %d years out of range",&local_41);
    OutOfRangeException::OutOfRangeException<long>
              ((OutOfRangeException *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    __cxa_throw(uVar4,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  iVar1.days = uStack_c;
  iVar1.months = local_10;
  iVar1.micros = local_8;
  return iVar1;
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		result.days = 0;
		result.micros = 0;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_YEAR,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %d years out of range", input);
		}
		return result;
	}